

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *ip;
  BYTE *iEnd;
  uint uVar1;
  int iVar2;
  U32 UVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  BYTE *pBVar9;
  uint uVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  ulong uVar13;
  int *piVar14;
  int *ip_00;
  int *piVar15;
  int iVar16;
  int iVar17;
  size_t offsetFound;
  U32 local_b8;
  U32 local_b4;
  size_t local_98;
  size_t local_90;
  BYTE *local_88;
  BYTE *local_80;
  BYTE *local_78;
  BYTE *local_70;
  ulong local_68;
  int *local_60;
  ZSTD_matchState_t *local_58;
  int local_4c;
  seqStore_t *local_48;
  BYTE *local_40;
  U32 *local_38;
  
  iEnd = (BYTE *)((long)src + srcSize);
  local_60 = (int *)((long)src + (srcSize - 8));
  local_88 = (ms->window).base;
  local_78 = (ms->window).dictBase;
  uVar1 = (ms->window).dictLimit;
  local_68 = (ulong)(ms->window).lowLimit;
  local_80 = local_88 + uVar1;
  local_70 = local_78 + uVar1;
  local_b4 = *rep;
  local_b8 = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  local_40 = local_78 + local_68;
  iVar4 = uVar1 - 1;
  ip_00 = (int *)((ulong)(local_80 == (BYTE *)src) + (long)src);
  local_58 = ms;
  local_48 = seqStore;
  local_38 = rep;
  do {
    while( true ) {
      if (local_60 <= ip_00) {
        *local_38 = local_b4;
        local_38[1] = local_b8;
        return (long)iEnd - (long)src;
      }
      iVar16 = (int)ip_00 - (int)local_88;
      uVar5 = (iVar16 - local_b4) + 1;
      pBVar9 = local_78;
      if (uVar1 <= uVar5) {
        pBVar9 = local_88;
      }
      if (((uint)local_68 < uVar5 && 2 < iVar4 - uVar5) &&
         (*(int *)((long)ip_00 + 1) == *(int *)(pBVar9 + uVar5))) {
        pBVar11 = local_70;
        if (uVar1 <= uVar5) {
          pBVar11 = iEnd;
        }
        sVar6 = ZSTD_count_2segments
                          ((BYTE *)((long)ip_00 + 5),(BYTE *)((long)(pBVar9 + uVar5) + 4),iEnd,
                           pBVar11,local_80);
        uVar13 = sVar6 + 4;
      }
      else {
        uVar13 = 0;
      }
      local_90 = 999999999;
      sVar6 = ZSTD_BtFindBestMatch_extDict_selectMLS(local_58,(BYTE *)ip_00,iEnd,&local_90);
      uVar8 = uVar13;
      if (uVar13 < sVar6) {
        uVar8 = sVar6;
      }
      if (3 < uVar8) break;
      ip_00 = (int *)((long)ip_00 + ((long)ip_00 - (long)src >> 8) + 1);
    }
    sVar7 = local_90;
    ip = ip_00;
    if (sVar6 <= uVar13) {
      sVar7 = 0;
      ip = (int *)((long)ip_00 + 1);
    }
LAB_003c1b2c:
    do {
      iVar17 = iVar16;
      sVar6 = uVar8;
      piVar15 = ip_00;
      piVar14 = ip;
      local_98 = sVar7;
      if (local_60 <= piVar15) break;
      ip = (int *)((long)piVar15 + 1);
      local_4c = iVar17 + 1;
      if (local_98 == 0) {
        local_98 = 0;
      }
      else {
        uVar5 = local_4c - local_b4;
        pBVar9 = local_88;
        if (uVar5 < uVar1) {
          pBVar9 = local_78;
        }
        if (((uint)local_68 < uVar5 && 2 < iVar4 - uVar5) && (*ip == *(int *)(pBVar9 + uVar5))) {
          pBVar11 = iEnd;
          if (uVar5 < uVar1) {
            pBVar11 = local_70;
          }
          sVar7 = ZSTD_count_2segments
                            ((BYTE *)((long)piVar15 + 5),(BYTE *)((long)(pBVar9 + uVar5) + 4),iEnd,
                             pBVar11,local_80);
          if (sVar7 < 0xfffffffffffffffc) {
            uVar10 = (int)local_98 + 1;
            uVar5 = 0x1f;
            if (uVar10 != 0) {
              for (; uVar10 >> uVar5 == 0; uVar5 = uVar5 - 1) {
              }
            }
            if ((int)((uVar5 ^ 0x1f) + (int)sVar6 * 3 + -0x1e) < (int)(sVar7 + 4) * 3) {
              local_98 = 0;
              piVar14 = ip;
              sVar6 = sVar7 + 4;
            }
          }
        }
      }
      local_90 = 999999999;
      uVar8 = ZSTD_BtFindBestMatch_extDict_selectMLS(local_58,(BYTE *)ip,iEnd,&local_90);
      if (3 < uVar8) {
        uVar10 = (int)local_98 + 1;
        uVar5 = 0x1f;
        if (uVar10 != 0) {
          for (; uVar10 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar10 = (int)local_90 + 1;
        iVar2 = 0x1f;
        if (uVar10 != 0) {
          for (; uVar10 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        sVar7 = local_90;
        ip_00 = ip;
        iVar16 = local_4c;
        if ((int)((uVar5 ^ 0x1f) + (int)sVar6 * 4 + -0x1b) < (int)uVar8 * 4 - iVar2)
        goto LAB_003c1b2c;
      }
      if (local_60 <= ip) break;
      ip = (int *)((long)piVar15 + 2);
      iVar16 = iVar17 + 2;
      if (local_98 == 0) {
        local_98 = 0;
      }
      else {
        uVar5 = iVar16 - local_b4;
        pBVar9 = local_88;
        if (uVar5 < uVar1) {
          pBVar9 = local_78;
        }
        if (((uint)local_68 < uVar5 && 2 < iVar4 - uVar5) && (*ip == *(int *)(pBVar9 + uVar5))) {
          pBVar11 = iEnd;
          if (uVar5 < uVar1) {
            pBVar11 = local_70;
          }
          sVar7 = ZSTD_count_2segments
                            ((BYTE *)((long)piVar15 + 6),(BYTE *)((long)(pBVar9 + uVar5) + 4),iEnd,
                             pBVar11,local_80);
          if (sVar7 < 0xfffffffffffffffc) {
            uVar10 = (int)local_98 + 1;
            uVar5 = 0x1f;
            if (uVar10 != 0) {
              for (; uVar10 >> uVar5 == 0; uVar5 = uVar5 - 1) {
              }
            }
            if ((int)((uVar5 ^ 0x1f) + (int)sVar6 * 4 + -0x1e) < (int)(sVar7 + 4) * 4) {
              local_98 = 0;
              piVar14 = ip;
              sVar6 = sVar7 + 4;
            }
          }
        }
      }
      local_90 = 999999999;
      uVar8 = ZSTD_BtFindBestMatch_extDict_selectMLS(local_58,(BYTE *)ip,iEnd,&local_90);
      if (uVar8 < 4) break;
      uVar10 = (int)local_98 + 1;
      uVar5 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar10 = (int)local_90 + 1;
      iVar17 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar17 == 0; iVar17 = iVar17 + -1) {
        }
      }
      sVar7 = local_90;
      ip_00 = ip;
    } while ((int)((uVar5 ^ 0x1f) + (int)sVar6 * 4 + -0x18) < (int)uVar8 * 4 - iVar17);
    if (local_98 == 0) {
      local_98 = 0;
    }
    else {
      pBVar12 = (BYTE *)((long)piVar14 + (-(long)local_88 - local_98) + 2);
      pBVar11 = local_80;
      pBVar9 = local_88;
      if ((uint)pBVar12 < uVar1) {
        pBVar11 = local_40;
        pBVar9 = local_78;
      }
      pBVar9 = pBVar9 + ((ulong)pBVar12 & 0xffffffff);
      for (; ((src < piVar14 && (pBVar11 < pBVar9)) && (*(BYTE *)((long)piVar14 + -1) == pBVar9[-1])
             ); piVar14 = (int *)((long)piVar14 + -1)) {
        pBVar9 = pBVar9 + -1;
        sVar6 = sVar6 + 1;
      }
      local_b8 = local_b4;
      local_b4 = (int)local_98 - 2;
    }
    ZSTD_storeSeq(local_48,(long)piVar14 - (long)src,src,(U32)local_98,sVar6 - 3);
    UVar3 = local_b8;
    for (src = (void *)((long)piVar14 + sVar6); local_b8 = UVar3, ip_00 = (int *)src,
        src <= local_60; src = (void *)((long)src + sVar6 + 4)) {
      uVar5 = (uint)((long)src - (long)(local_88 + local_b8));
      pBVar9 = local_88;
      if (uVar5 < uVar1) {
        pBVar9 = local_78;
      }
      if (((uVar5 <= (uint)local_68) || (iVar4 - uVar5 < 3)) ||
         (*src != *(int *)(pBVar9 + ((long)src - (long)(local_88 + local_b8) & 0xffffffff)))) break;
      pBVar11 = iEnd;
      if (uVar5 < uVar1) {
        pBVar11 = local_70;
      }
      sVar6 = ZSTD_count_2segments
                        ((BYTE *)((long)src + 4),
                         (BYTE *)((long)(pBVar9 + ((long)src - (long)(local_88 + local_b8) &
                                                  0xffffffff)) + 4),iEnd,pBVar11,local_80);
      ZSTD_storeSeq(local_48,0,src,0,sVar6 + 1);
      UVar3 = local_b4;
      local_b4 = local_b8;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, 1, 2);
}